

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<float>::Insert_Leaf(BpTree<float> *this,IndexNode<float> *C,float k,Addr p)

{
  vector<float,_std::allocator<float>_> *__x;
  vector<char,_std::allocator<char>_> *__x_00;
  vector<Addr,_std::allocator<Addr>_> *__x_01;
  float *pfVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pfVar4;
  pointer pAVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  vector<float,_std::allocator<float>_> local_88;
  vector<char,_std::allocator<char>_> local_70;
  vector<Addr,_std::allocator<Addr>_> local_58;
  Addr local_40;
  Addr AStack_38;
  
  __x = &C->k;
  std::vector<float,_std::allocator<float>_>::vector(&local_88,__x);
  __x_00 = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_70,__x_00);
  __x_01 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,__x_01);
  local_40 = C->parent;
  AStack_38 = C->self;
  Buffer::Lock(&blocks,AStack_38.BlockNum);
  if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar2 = this->N;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      if ((__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar7] != '1') goto LAB_00130ef3;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
    uVar7 = (ulong)uVar2;
  }
LAB_00130ef3:
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      if (((__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start[uVar6] != '1') ||
         (pfVar1 = (__x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar6, k < *pfVar1 || k == *pfVar1))
      goto LAB_00130f15;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
    uVar6 = (ulong)uVar2;
  }
LAB_00130f15:
  if ((int)uVar6 < (int)uVar7) {
    lVar8 = (long)(int)uVar7;
    do {
      pcVar3 = (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3[lVar8] = pcVar3[lVar8 + -1];
      pfVar4 = (__x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4[lVar8] = pfVar4[lVar8 + -1];
      pAVar5 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pAVar5[lVar8] = pAVar5[lVar8 + -1];
      lVar8 = lVar8 + -1;
    } while ((int)uVar6 < lVar8);
  }
  uVar6 = uVar6 & 0xffffffff;
  (__x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar6] = k;
  (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar6] = p;
  (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar6] = '1';
  return;
}

Assistant:

void BpTree<K>::Insert_Leaf(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	//�õ���Ӧ��ַ�����ã���C�޸ļ��ɶ�ԭ���޸�
	int pos, i, j;
	for (i = 0; i < N && C.v[i] == '1'; i++);							//��iλ���п�
	for (pos = 0; pos < N && C.v[pos] == '1' && C.k[pos] < k; pos++);	//pos���Ժ���Ҫ��Ǩ
	for (j = i; j > pos; j--) {
		C.v[j] = C.v[j - 1];
		C.k[j] = C.k[j - 1];
		C.p[j] = C.p[j - 1];
	}
	C.k[pos] = k;
	C.p[pos] = p;
	C.v[pos] = '1';
}